

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void item_menu_browser(wchar_t oid,void *data,region_conflict *param_3)

{
  ulong uVar1;
  wchar_t wVar2;
  ulong uVar3;
  char *pcVar4;
  wchar_t wVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  char tmp_val [80];
  char local_88 [88];
  
  wVar5 = num_obj;
  uVar1 = (long)(player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
          (long)(int)(uint)z_info->quiver_slot_size;
  uVar3 = uVar1 & 0xffffffff;
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'\0';
  text_out_indent = param_3->col + L'\xffffffff';
  text_out_pad = L'\x01';
  wVar2 = param_3->col + L'\xffffffff';
  if (param_3->col < L'\x02') {
    wVar2 = L'\0';
  }
  prt("",param_3->page_rows + param_3->row,wVar2);
  Term_gotoxy(param_3->col,param_3->page_rows + param_3->row);
  if (((((undefined1)olist_mode & OLIST_QUIVER) != OLIST_NONE) &&
      (player->upkeep->command_wrk == L'\x02')) && (iVar7 = (int)uVar1, 0 < iVar7)) {
    pcVar6 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ" + wVar5;
    do {
      if ((int)uVar3 == 1) {
        uVar8 = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * (iVar7 + -1);
      }
      else {
        uVar8 = (uint)z_info->quiver_slot_size;
      }
      strnfmt(local_88,0x50,"%c) ",(ulong)(uint)(int)*pcVar6);
      text_out_c('\x02',local_88,(ulong)(uint)(param_3->row + wVar5),(ulong)(uint)param_3->col);
      pcVar4 = "s";
      if (uVar8 == 1) {
        pcVar4 = "";
      }
      strnfmt(local_88,0x50,"in Quiver: %d missile%s\n",(ulong)uVar8,pcVar4);
      text_out_c('\x0f',local_88,(ulong)(uint)(param_3->row + wVar5),
                 (ulong)(uint)(param_3->col + L'\x03'));
      pcVar6 = pcVar6 + 1;
      wVar5 = wVar5 + L'\x01';
      uVar8 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  wVar2 = L'\0';
  if (L'\x01' < param_3->col) {
    wVar2 = param_3->col + L'\xffffffff';
  }
  prt("",param_3->row + wVar5,wVar2);
  while ((1 < tile_height && ((wVar5 + param_3->row) % (int)(uint)tile_height != 0))) {
    wVar2 = param_3->col + L'\xffffffff';
    if (param_3->col < L'\x02') {
      wVar2 = L'\0';
    }
    prt("",wVar5 + param_3->row + L'\x01',wVar2);
    wVar5 = wVar5 + L'\x01';
  }
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

static void item_menu_browser(int oid, void *data, const region *local_area)
{
	char tmp_val[80];
	int count, j, i = num_obj;
	int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1)
		/ z_info->quiver_slot_size;

	/* Set up to output below the menu */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 0;
	text_out_indent = local_area->col - 1;
	text_out_pad = 1;
	prt("", local_area->row + local_area->page_rows, MAX(0, local_area->col - 1));
	Term_gotoxy(local_area->col, local_area->row + local_area->page_rows);

	/* If we're printing pack slots the quiver takes up */
	if (olist_mode & OLIST_QUIVER && player->upkeep->command_wrk == USE_INVEN) {
		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s\n";
			char letter = all_letters_nohjkl[i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size *
													  (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			text_out_c(COLOUR_SLATE, tmp_val, local_area->row + i, local_area->col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			text_out_c(COLOUR_L_UMBER, tmp_val, local_area->row + i, local_area->col + 3);
		}
	}

	/* Always print a blank line */
	prt("", local_area->row + i, MAX(0, local_area->col - 1));

	/* Blank out whole tiles */
	while ((tile_height > 1) && ((local_area->row + i) % tile_height != 0)) {
		i++;
		prt("", local_area->row + i, MAX(0, local_area->col - 1));
	}

	text_out_pad = 0;
	text_out_indent = 0;
}